

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::FunctionValidator::create(FunctionValidator *this)

{
  long in_RSI;
  pointer local_28;
  pointer local_20;
  
  local_20 = *(pointer *)(in_RSI + 0x108);
  std::make_unique<wasm::FunctionValidator,wasm::Module&,wasm::ValidationInfo*>
            ((Module *)&stack0xffffffffffffffd8,*(ValidationInfo ***)(in_RSI + 0x100));
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)local_28;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionValidator>(*getModule(), &info);
  }